

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  uint *puVar1;
  uint uVar2;
  uv_stdio_container_t *puVar3;
  long lVar4;
  uv_loop_t *puVar5;
  int iVar6;
  __pid_t __pid;
  __pid_t _Var7;
  int (*pipes) [2];
  ulong uVar8;
  long *plVar9;
  ssize_t sVar10;
  int *piVar11;
  uint stdio_count;
  long lVar12;
  ulong uVar13;
  int (*__fds) [2];
  uv_rwlock_t *rwlock;
  long lVar14;
  int signal_pipe [2];
  int status;
  int exec_errorno;
  uv_process_t *local_90;
  uv_loop_t *local_88;
  void **local_80;
  int pipes_storage [8] [2];
  
  signal_pipe[0] = -1;
  signal_pipe[1] = -1;
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/process.c"
                  ,0x1aa,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0x7f < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_HIDE_CONSOLE | UV_PROCESS_WINDOWS_HIDE_GUI | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/process.c"
                  ,0x1b1,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  process->handle_queue[0] = loop->handle_queue;
  plVar9 = (long *)loop->handle_queue[1];
  process->handle_queue[1] = plVar9;
  *plVar9 = (long)process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  local_80 = process->queue;
  process->queue[0] = local_80;
  process->queue[1] = local_80;
  uVar2 = options->stdio_count;
  stdio_count = 3;
  if (3 < (int)uVar2) {
    stdio_count = uVar2;
  }
  uVar13 = (ulong)stdio_count;
  if ((int)uVar2 < 9) {
    pipes = pipes_storage;
  }
  else {
    pipes = (int (*) [2])uv__malloc(uVar13 * 8);
    if (pipes == (int (*) [2])0x0) {
      return -0xc;
    }
  }
  for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
    pipes[uVar8] = (int  [2])0xffffffffffffffff;
  }
  lVar12 = 8;
  __fds = pipes;
  local_90 = process;
  local_88 = loop;
  for (lVar14 = 0; lVar14 < options->stdio_count; lVar14 = lVar14 + 1) {
    puVar3 = options->stdio;
    uVar2 = *(uint *)((long)puVar3 + lVar12 + -8);
    switch(uVar2 & 7) {
    case 0:
      break;
    case 1:
      lVar4 = *(long *)((long)&puVar3->flags + lVar12);
      if (lVar4 == 0) {
        __assert_fail("container->data.stream != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/process.c"
                      ,0xbf,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
      }
      if (*(int *)(lVar4 + 0x10) != 7) {
LAB_00112e16:
        iVar6 = -0x16;
        goto LAB_00112e4e;
      }
      iVar6 = socketpair(1,0x80001,0,*__fds);
      if (iVar6 != 0) {
        piVar11 = __errno_location();
        if (*piVar11 != 0) {
          iVar6 = -*piVar11;
          goto LAB_00112e4e;
        }
      }
      break;
    case 2:
    case 4:
      plVar9 = (long *)((long)&puVar3->flags + lVar12);
      if ((uVar2 & 2) == 0) {
        plVar9 = (long *)(*plVar9 + 0xb8);
      }
      if ((int)*plVar9 == -1) goto LAB_00112e16;
      (*__fds)[1] = (int)*plVar9;
      break;
    default:
      __assert_fail("0 && \"Unexpected flags\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/process.c"
                    ,0xd3,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
    }
    __fds = __fds + 1;
    lVar12 = lVar12 + 0x10;
  }
  iVar6 = uv__make_pipe(signal_pipe,0);
  puVar5 = local_88;
  if (iVar6 == 0) {
    uv_signal_start(&local_88->child_watcher,uv__chld,0x11);
    rwlock = &puVar5->cloexec_lock;
    uv_rwlock_wrlock(rwlock);
    __pid = fork();
    if (__pid != -1) {
      if (__pid == 0) {
        uv__process_child_init(options,stdio_count,pipes,signal_pipe[1]);
        goto LAB_001130a3;
      }
      uv_rwlock_wrunlock(rwlock);
      uv__close(signal_pipe[1]);
      local_90->status = 0;
      exec_errorno = 0;
      do {
        sVar10 = read(signal_pipe[0],&exec_errorno,4);
        if (sVar10 != -1) {
          if (sVar10 == 0) goto LAB_00112ed2;
          if (sVar10 != 4) goto LAB_0011304d;
          goto LAB_00112eab;
        }
        piVar11 = __errno_location();
      } while (*piVar11 == 4);
      if (*piVar11 != 0x20) {
LAB_0011304d:
        abort();
      }
      do {
        _Var7 = waitpid(__pid,&status,0);
        if (_Var7 != -1) break;
      } while (*piVar11 == 4);
      if (_Var7 != __pid) {
        __assert_fail("err == pid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/process.c"
                      ,0x20d,
                      "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
      }
      goto LAB_00112ed2;
    }
    piVar11 = __errno_location();
    iVar6 = -*piVar11;
    uv_rwlock_wrunlock(rwlock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
  }
LAB_00112e4e:
  lVar12 = 0;
  for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
    if (((long)options->stdio_count <= (long)uVar8) ||
       ((*(byte *)((long)&options->stdio->flags + lVar12) & 6) == 0)) {
      if (pipes[uVar8][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar8][0]);
      }
      if (pipes[uVar8][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar8][1]);
      }
    }
    lVar12 = lVar12 + 0x10;
  }
LAB_00112fbd:
  if (pipes != pipes_storage) {
    uv__free(pipes);
  }
  return iVar6;
  while (piVar11 = __errno_location(), *piVar11 == 4) {
LAB_00112eab:
    _Var7 = waitpid(__pid,&status,0);
    if (_Var7 != -1) break;
  }
  if (_Var7 != __pid) {
LAB_001130a3:
    __assert_fail("err == pid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/process.c"
                  ,0x208,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
LAB_00112ed2:
  uv__close_nocheckstdio(signal_pipe[0]);
  lVar14 = 0;
  for (lVar12 = 0; lVar12 < options->stdio_count; lVar12 = lVar12 + 1) {
    puVar3 = options->stdio;
    if (((*(byte *)((long)&puVar3->flags + lVar14) & 1) != 0) && (-1 < pipes[lVar12][0])) {
      iVar6 = uv__close(pipes[lVar12][1]);
      if (iVar6 != 0) goto LAB_0011304d;
      pipes[lVar12][1] = -1;
      uv__nonblock_ioctl(pipes[lVar12][0],1);
      uVar2 = *(uint *)((long)&puVar3->flags + lVar14);
      iVar6 = uv__stream_open(*(uv_stream_t **)((long)&puVar3->data + lVar14),pipes[lVar12][0],
                              (uVar2 & 0x10) << 0xb | (uVar2 & 0x20) << 9);
      if (iVar6 != 0) goto LAB_00112fea;
    }
    lVar14 = lVar14 + 0x10;
  }
  if (exec_errorno == 0) {
    local_90->queue[0] = local_88->process_handles;
    plVar9 = (long *)local_88->process_handles[1];
    local_90->queue[1] = plVar9;
    *plVar9 = (long)local_80;
    local_88->process_handles[1] = local_80;
    uVar2 = local_90->flags;
    if (((uVar2 & 4) == 0) && (local_90->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
      puVar1 = &local_90->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  local_90->pid = __pid;
  local_90->exit_cb = options->exit_cb;
  iVar6 = exec_errorno;
  goto LAB_00112fbd;
LAB_00112fea:
  for (; lVar14 != 0; lVar14 = lVar14 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar14) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar14 + -8));
    }
  }
  goto LAB_00112e4e;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return UV_ENOSYS;
#else
  int signal_pipe[2] = { -1, -1 };
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;
  int status;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  /* Acquire write lock to prevent opening new fds in worker threads */
  uv_rwlock_wrlock(&loop->cloexec_lock);
  pid = fork();

  if (pid == -1) {
    err = UV__ERR(errno);
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  /* Release lock in parent process */
  uv_rwlock_wrunlock(&loop->cloexec_lock);
  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno)) {
    do
      err = waitpid(pid, &status, 0); /* okay, read errorno */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else if (r == -1 && errno == EPIPE) {
    do
      err = waitpid(pid, &status, 0); /* okay, got EPIPE */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else
    abort();

  uv__close_nocheckstdio(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}